

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tokenizer-0.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  FILE *pFVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  ostream *poVar11;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar12;
  int *tok;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  ofstream ofs;
  string fname_out_1;
  int64_t t_end;
  int64_t t_start;
  vector<int,_std::allocator<int>_> res;
  ifstream ifs;
  string text;
  int i_1;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int nthread;
  bool add_special;
  llama_tests k_tests;
  bool success;
  llama_context_params cparams;
  llama_model_params mparams;
  llama_context *ctx;
  llama_model *model;
  string fname_text;
  string fname_out;
  string fname_inp;
  string fname;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined2 uVar22;
  undefined1 parse_special;
  undefined1 add_special_00;
  undefined4 in_stack_fffffffffffff6d0;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffff6d4;
  undefined4 uVar24;
  undefined4 in_stack_fffffffffffff6d8;
  undefined4 uVar25;
  undefined4 in_stack_fffffffffffff6dc;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 uVar27;
  undefined4 in_stack_fffffffffffff6e4;
  undefined4 uVar28;
  char *in_stack_fffffffffffff6e8;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  streambuf_type *psVar29;
  streambuf_type *psVar30;
  undefined8 uVar31;
  char *local_8d8;
  string local_800 [32];
  reference local_7e0;
  int *local_7d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_7d0;
  vector<int,_std::allocator<int>_> *local_7c8;
  long local_7c0 [64];
  string local_5c0 [32];
  long local_5a0;
  long local_580;
  vector<int,_std::allocator<int>_> local_578;
  allocator<char> local_559 [33];
  string local_538 [32];
  long local_518 [65];
  string local_310 [36];
  int local_2ec;
  int local_2e8;
  undefined1 *local_2e0;
  long *local_2d8;
  byte *local_2d0;
  int local_2c0;
  vector<std::thread,_std::allocator<std::thread>_> local_2b8;
  int local_2a0;
  undefined1 local_299;
  string *local_298;
  string *local_290;
  string *local_288;
  undefined1 local_280 [55];
  byte local_249;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  allocator<char> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_200;
  streambuf_type *local_1f8;
  undefined8 uStack_1f0;
  streambuf_type *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  allocator<char> *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_180;
  streambuf_type *local_178;
  undefined8 uStack_170;
  streambuf_type *local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  uint local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long local_b8;
  long local_b0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    fprintf(_stderr,"Usage: %s vocab-file [text-file]\n",*in_RSI);
    return 1;
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  std::allocator<char>::~allocator(&local_31);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                 (char *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                 (char *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
  std::__cxx11::string::string(local_a8);
  if (2 < local_8) {
    std::__cxx11::string::operator=(local_a8,(char *)local_10[2]);
  }
  pFVar1 = _stderr;
  uVar8 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%s : reading vocab from: \'%s\'\n","main",uVar8);
  llama_backend_init();
  llama_model_default_params(&local_100);
  local_c0 = 1;
  uVar8 = std::__cxx11::string::c_str();
  local_108 = CONCAT71(uStack_bf,local_c0);
  local_118 = local_d0;
  uStack_110 = uStack_c8;
  local_128 = local_e0;
  uStack_120 = uStack_d8;
  local_138 = local_f0;
  uStack_130 = uStack_e8;
  local_148 = local_100;
  uStack_140 = uStack_f8;
  local_b0 = llama_model_load_from_file(uVar8);
  pFVar1 = _stderr;
  if (local_b0 == 0) {
    uVar8 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s: error: failed to load vocab \'%s\'\n","main",uVar8);
    local_4 = 1;
    local_14c = 1;
    goto LAB_00153f48;
  }
  llama_context_default_params(&local_1c8);
  local_1d8 = local_158;
  local_1e8 = local_168;
  uStack_1e0 = uStack_160;
  local_1f8 = local_178;
  uStack_1f0 = uStack_170;
  local_208 = local_188;
  pbStack_200 = pbStack_180;
  local_218 = local_198;
  uVar5 = local_218;
  uStack_210 = uStack_190;
  uVar6 = uStack_210;
  local_228 = local_1a8;
  uVar3 = local_228;
  uStack_220 = uStack_1a0;
  uVar4 = uStack_220;
  local_238 = local_1b8;
  uVar10 = local_238;
  uStack_230 = uStack_1b0;
  uVar2 = uStack_230;
  local_248 = local_1c8;
  uVar8 = local_248;
  uStack_240 = uStack_1c0;
  uVar31 = uStack_240;
  local_248._0_4_ = (undefined4)local_1c8;
  local_248._4_4_ = (undefined4)((ulong)local_1c8 >> 0x20);
  uStack_240._0_4_ = (undefined4)uStack_1c0;
  uStack_240._4_4_ = (undefined4)((ulong)uStack_1c0 >> 0x20);
  local_238._0_4_ = (undefined4)local_1b8;
  local_238._4_4_ = (undefined4)((ulong)local_1b8 >> 0x20);
  uStack_230._0_4_ = (undefined4)uStack_1b0;
  uStack_230._4_4_ = (undefined4)((ulong)uStack_1b0 >> 0x20);
  local_228._0_4_ = (undefined4)local_1a8;
  uStack_220._0_4_ = (undefined4)uStack_1a0;
  uStack_220._4_4_ = (undefined4)((ulong)uStack_1a0 >> 0x20);
  local_218._0_4_ = (undefined4)local_198;
  local_218._4_4_ = (undefined4)((ulong)local_198 >> 0x20);
  uStack_210._0_4_ = (undefined4)uStack_190;
  uStack_210._4_4_ = (undefined4)((ulong)uStack_190 >> 0x20);
  uVar22 = (undefined2)((ulong)local_1a8 >> 0x20);
  parse_special = (undefined1)((ulong)local_1a8 >> 0x30);
  add_special_00 = (undefined1)((ulong)local_1a8 >> 0x38);
  uVar13 = (undefined4)local_248;
  uVar14 = local_248._4_4_;
  uVar15 = (undefined4)uStack_240;
  uVar16 = uStack_240._4_4_;
  uVar17 = (undefined4)local_238;
  uVar18 = local_238._4_4_;
  uVar19 = (undefined4)uStack_230;
  uVar20 = uStack_230._4_4_;
  uVar21 = (undefined4)local_228;
  uVar23 = (undefined4)uStack_220;
  uVar24 = uStack_220._4_4_;
  uVar25 = (undefined4)local_218;
  uVar26 = local_218._4_4_;
  uVar27 = (undefined4)uStack_210;
  uVar28 = uStack_210._4_4_;
  local_248 = uVar8;
  uStack_240 = uVar31;
  local_238 = uVar10;
  uStack_230 = uVar2;
  local_228 = uVar3;
  uStack_220 = uVar4;
  local_218 = uVar5;
  uStack_210 = uVar6;
  local_b8 = llama_init_from_model(local_b0);
  pFVar1 = _stderr;
  if (local_b8 == 0) {
    uVar8 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s: error: failed to load vocab \'%s\'\n","main",uVar8);
    llama_model_free(local_b0);
    local_4 = 1;
    local_14c = 1;
    goto LAB_00153f48;
  }
  local_249 = 1;
  local_298 = local_a8;
  local_290 = local_68;
  local_288 = local_88;
  main::$_0::operator()[abi_cxx11_
            ((anon_class_24_3_5da88fb3 *)
             CONCAT17(add_special_00,CONCAT16(parse_special,CONCAT24(uVar22,uVar21))));
  local_299 = 0;
  local_2a0 = std::thread::hardware_concurrency();
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x153683);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)CONCAT44(uVar24,uVar23),
             CONCAT17(add_special_00,CONCAT16(parse_special,CONCAT24(uVar22,uVar21))),
             (allocator_type *)CONCAT44(uVar20,uVar19));
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1536af);
  __a = local_188;
  this = pbStack_180;
  psVar29 = local_178;
  uVar8 = uStack_170;
  psVar30 = local_168;
  uVar31 = uStack_160;
  for (local_2c0 = 0; local_2c0 < local_2a0; local_2c0 = local_2c0 + 1) {
    local_2e8 = local_2c0;
    local_2e0 = local_280;
    local_2d8 = &local_b8;
    local_2d0 = &local_249;
    std::thread::thread<main::__1,,void>
              ((thread *)CONCAT44(uVar28,uVar27),(type *)CONCAT44(uVar26,uVar25));
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_2b8,(long)local_2c0);
    std::thread::operator=((thread *)CONCAT44(uVar16,uVar15),(thread *)CONCAT44(uVar14,uVar13));
    std::thread::~thread((thread *)0x153755);
  }
  for (local_2ec = 0; local_2ec < local_2a0; local_2ec = local_2ec + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_2b8,(long)local_2ec);
    std::thread::join();
  }
  uVar9 = std::__cxx11::string::empty();
  pFVar1 = _stderr;
  if ((uVar9 & 1) == 0) {
    uVar10 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s : tokenizing: \'%s\'\n","main",uVar10);
    std::__cxx11::string::string(local_310);
    std::ifstream::ifstream(local_518,local_a8,8);
    bVar7 = std::ios::operator!((ios *)((long)local_518 + *(long *)(local_518[0] + -0x18)));
    pFVar1 = _stderr;
    bVar12 = (bVar7 & 1) != 0;
    if (bVar12) {
      std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s : error: could not open file \'%s\'\n","main");
      local_4 = 1;
    }
    else {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)CONCAT44(uVar20,uVar19),
                 (istream_type *)CONCAT44(uVar18,uVar17));
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)CONCAT44(uVar16,uVar15));
      std::allocator<char>::allocator();
      __beg._8_8_ = uVar31;
      __beg._M_sbuf = psVar30;
      __end._8_8_ = uVar8;
      __end._M_sbuf = psVar29;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                (this,__beg,__end,__a);
      std::__cxx11::string::operator=(local_310,local_538);
      std::__cxx11::string::~string(local_538);
      std::allocator<char>::~allocator(local_559);
    }
    local_14c = (uint)bVar12;
    std::ifstream::~ifstream(local_518);
    pFVar1 = _stderr;
    if (local_14c == 0) {
      uVar8 = std::__cxx11::string::size();
      fprintf(pFVar1,"%s : text size: %zu\n","main",uVar8);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x153a4d);
      local_580 = ggml_time_us();
      common_tokenize((llama_context *)CONCAT44(uVar26,uVar25),(string *)CONCAT44(uVar24,uVar23),
                      (bool)add_special_00,(bool)parse_special);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar20,uVar19),
                 (vector<int,_std::allocator<int>_> *)CONCAT44(uVar18,uVar17));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar20,uVar19));
      local_5a0 = ggml_time_us();
      fprintf(_stderr,"%s : tokenized in %.3f ms (cpp)\n",
              SUB84((double)(local_5a0 - local_580) / 1000.0,0));
      pFVar1 = _stderr;
      std::vector<int,_std::allocator<int>_>::size(&local_578);
      fprintf(pFVar1,"%s : tokens: %zu\n","main");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar26,uVar25),(char *)CONCAT44(uVar24,uVar23));
      std::ofstream::ofstream(local_7c0,local_5c0,0x10);
      bVar7 = std::ios::operator!((ios *)((long)local_7c0 + *(long *)(local_7c0[0] + -0x18)));
      pFVar1 = _stderr;
      if ((bVar7 & 1) == 0) {
        local_7c8 = &local_578;
        local_7d0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar14,uVar13));
        local_7d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar14,uVar13));
        while (bVar12 = __gnu_cxx::operator!=
                                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)CONCAT44(uVar16,uVar15),
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)CONCAT44(uVar14,uVar13)), bVar12) {
          local_7e0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&local_7d0);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_7c0,*local_7e0);
          std::operator<<(poVar11,"\n");
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_7d0);
        }
        local_14c = 0;
      }
      else {
        std::__cxx11::string::c_str();
        fprintf(pFVar1,"%s : error: could not open file \'%s\'\n","main");
        local_4 = 1;
        local_14c = 1;
      }
      std::ofstream::~ofstream(local_7c0);
      std::__cxx11::string::~string(local_5c0);
      pFVar1 = _stderr;
      if (local_14c == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar26,uVar25),(char *)CONCAT44(uVar24,uVar23));
        std::__cxx11::string::c_str();
        fprintf(pFVar1,"%s : tokens written to \'%s\'\n","main");
        std::__cxx11::string::~string(local_800);
        local_14c = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar20,uVar19));
    }
    std::__cxx11::string::~string(local_310);
    if (local_14c == 0) goto LAB_00153e71;
  }
  else {
LAB_00153e71:
    llama_model_free(local_b0);
    llama_free(local_b8);
    llama_backend_free();
    printf("\n");
    if ((local_249 & 1) == 0) {
      local_8d8 = "failed";
    }
    else {
      local_8d8 = "passed";
    }
    printf("Tests %s\n",local_8d8);
    local_4 = 3;
    if ((local_249 & 1) != 0) {
      local_4 = 0;
    }
    local_14c = 1;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)CONCAT44(uVar20,uVar19));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)0x153f2a);
LAB_00153f48:
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        fprintf(stderr, "Usage: %s vocab-file [text-file]\n", argv[0]);
        return 1;
    }

    const std::string fname = argv[1];

    const std::string fname_inp = fname + ".inp";
    const std::string fname_out = fname + ".out";

    std::string fname_text;
    if (argc > 2) {
        fname_text = argv[2];
    }

    fprintf(stderr, "%s : reading vocab from: '%s'\n", __func__, fname.c_str());

    llama_model * model;
    llama_context * ctx;

    llama_backend_init();

    // load the vocab
    {
        auto mparams = llama_model_default_params();

        mparams.vocab_only = true;

        model = llama_model_load_from_file(fname.c_str(), mparams);

        if (model == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            return 1;
        }

        auto cparams = llama_context_default_params();

        ctx = llama_init_from_model(model, cparams);

        if (ctx == NULL) {
            fprintf(stderr, "%s: error: failed to load vocab '%s'\n", __func__, fname.c_str());
            llama_model_free(model);
            return 1;
        }
    }

#ifdef _WIN32
    // We need this for unicode console support
    console::init(false, false);
    atexit([]() { console::cleanup(); });
#endif

    bool success = true;

    const auto k_tests = [&]() -> llama_tests {
        if (!fname_text.empty()) {
            return {};
        }

        const auto res = read_tests(fname_inp, fname_out);

        if (res.empty()) {
            fprintf(stderr, "%s : error: no tests found\n", __func__);
            exit(1);
        }

        return res;
    }();

    const bool add_special = false;

    // multi-threaded tokenization
    const int nthread = std::thread::hardware_concurrency();
    std::vector<std::thread> threads(nthread);

    for (int i = 0; i < nthread; i++) {
        threads[i] = std::thread([&, i]() {
            for (const auto & test_kv : k_tests) {
                const std::vector<llama_token> res = common_tokenize(ctx, test_kv.first, add_special, false);

                // here only print the result of the first thread
                // because the other threads are running the same tests
                if (i != 0) {
                    continue;
                }

                printf("\n");
                printf("src: '%s'\n", test_kv.first.c_str());
                printf("res: '%s'\n", common_detokenize(ctx, res).c_str());
                printf("tok: ");
                for (const auto & tok : res) {
                    printf("%d ", tok);
                }
                printf("\n");

                bool correct = res.size() == test_kv.second.size();
                for (int i = 0; i < (int) res.size() && correct; ++i) {
                    if (test_kv.second[i] != res[i]) {
                        correct = false;
                    }
                }

                if (!correct) {
                    fprintf(stderr, "%s : failed test:    '%s'\n", __func__, test_kv.first.c_str());
                    fprintf(stderr, "%s : detokenized to: '%s' instead of '%s'\n", __func__,
                        common_detokenize(ctx, res).c_str(),
                        common_detokenize(ctx, test_kv.second).c_str());
                    fprintf(stderr, "%s : expected tokens: ", __func__);
                    for (const auto & t : test_kv.second) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");
                    fprintf(stderr, "%s : got tokens:      ", __func__);
                    for (const auto & t : res) {
                        fprintf(stderr, "%6d '%s', ", t, common_token_to_piece(ctx, t).c_str());
                    }
                    fprintf(stderr, "\n");

                    success = false;
                }
            }
        });
    }

    for (int i = 0; i < nthread; i++) {
        threads[i].join();
    }

    // single threaded tokenization
    if (!fname_text.empty()) {
        fprintf(stderr, "%s : tokenizing: '%s'\n", __func__, fname_text.c_str());

        std::string text;
        {
            std::ifstream ifs(fname_text);
            if (!ifs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_text.c_str());
                return 1;
            }
            text = std::string(std::istreambuf_iterator<char>(ifs), std::istreambuf_iterator<char>());
        }

        fprintf(stderr, "%s : text size: %zu\n", __func__, text.size());

        std::vector<llama_token> res;

        {
            const auto t_start = ggml_time_us();

            res = common_tokenize(ctx, text, add_special, false);

            const auto t_end = ggml_time_us();

            fprintf(stderr, "%s : tokenized in %.3f ms (cpp)\n", __func__, (t_end - t_start) / 1000.0);
        }

        fprintf(stderr, "%s : tokens: %zu\n", __func__, res.size());

        {
            const std::string fname_out = fname_text + ".tokcpp";

            std::ofstream ofs(fname_out);
            if (!ofs) {
                fprintf(stderr, "%s : error: could not open file '%s'\n", __func__, fname_out.c_str());
                return 1;
            }

            for (const auto & tok : res) {
                //ofs << tok << " '" << string_strip(llama_detokenize(ctx, std::vector<int>{tok})) << "'" << std::endl;
                ofs << tok << "\n";
            }
        }

        fprintf(stderr, "%s : tokens written to '%s'\n", __func__, (fname_text + ".tokcpp").c_str());
    }

    llama_model_free(model);
    llama_free(ctx);

    llama_backend_free();

    printf("\n");
    printf("Tests %s\n", success ? "passed" : "failed");

    return success ? 0 : 3;
}